

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.hpp
# Opt level: O0

void __thiscall
Diligent::BottomLevelASBase<Diligent::EngineVkImplTraits>::CopyGeometryDescriptionUnsafe
          (BottomLevelASBase<Diligent::EngineVkImplTraits> *this,BottomLevelASDesc *SrcDesc,
          BLASNameToIndex *pSrcNameToIndex)

{
  IMemoryAllocator *Allocator;
  void *pvVar1;
  undefined1 local_70 [8];
  FixedLinearAllocator MemPool;
  BLASNameToIndex *pSrcNameToIndex_local;
  BottomLevelASDesc *SrcDesc_local;
  BottomLevelASBase<Diligent::EngineVkImplTraits> *this_local;
  
  MemPool._72_8_ = pSrcNameToIndex;
  Allocator = GetRawAllocator();
  FixedLinearAllocator::FixedLinearAllocator((FixedLinearAllocator *)local_70,Allocator);
  CopyBLASGeometryDesc
            (SrcDesc,&(this->
                      super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                      ).m_Desc,(FixedLinearAllocator *)local_70,(BLASNameToIndex *)MemPool._72_8_,
             &this->m_NameToIndex);
  pvVar1 = FixedLinearAllocator::Release((FixedLinearAllocator *)local_70);
  this->m_pRawPtr = pvVar1;
  FixedLinearAllocator::~FixedLinearAllocator((FixedLinearAllocator *)local_70);
  return;
}

Assistant:

void CopyGeometryDescriptionUnsafe(const BottomLevelASDesc& SrcDesc, const BLASNameToIndex* pSrcNameToIndex) noexcept(false)
    {
        FixedLinearAllocator MemPool{GetRawAllocator()};
        CopyBLASGeometryDesc(SrcDesc, this->m_Desc, MemPool, pSrcNameToIndex, this->m_NameToIndex);
        this->m_pRawPtr = MemPool.Release();
    }